

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O0

void __thiscall icu_63::UVector32::assign(UVector32 *this,UVector32 *other,UErrorCode *ec)

{
  UBool UVar1;
  int local_24;
  int32_t i;
  UErrorCode *ec_local;
  UVector32 *other_local;
  UVector32 *this_local;
  
  UVar1 = ensureCapacity(this,other->count,ec);
  if (UVar1 != '\0') {
    setSize(this,other->count);
    for (local_24 = 0; local_24 < other->count; local_24 = local_24 + 1) {
      this->elements[local_24] = other->elements[local_24];
    }
  }
  return;
}

Assistant:

void UVector32::assign(const UVector32& other, UErrorCode &ec) {
    if (ensureCapacity(other.count, ec)) {
        setSize(other.count);
        for (int32_t i=0; i<other.count; ++i) {
            elements[i] = other.elements[i];
        }
    }
}